

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLubyte *pGVar2;
  GLubyte *extensions;
  char *en;
  GLint count;
  int i;
  _GLFWwindow *window;
  char *extension_local;
  
  window = (_GLFWwindow *)extension;
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    extension_local._4_4_ = 0;
  }
  else {
    _count = _glfwPlatformGetCurrentContext();
    if (_count == (_GLFWwindow *)0x0) {
      _glfwInputError(0x10002,(char *)0x0);
      extension_local._4_4_ = 0;
    }
    else if (*(char *)&window->next == '\0') {
      _glfwInputError(0x10004,(char *)0x0);
      extension_local._4_4_ = 0;
    }
    else {
      if ((_count->context).major < 3) {
        pGVar2 = (GLubyte *)glGetString(0x1f03);
        if (pGVar2 == (GLubyte *)0x0) {
          _glfwInputError(0x10008,"Failed to retrieve extension string");
          return 0;
        }
        iVar1 = _glfwStringInExtensionString((char *)window,pGVar2);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        glGetIntegerv(0x821d,&en);
        for (en._4_4_ = 0; (int)en._4_4_ < (int)en; en._4_4_ = en._4_4_ + 1) {
          pGVar2 = (*_count->GetStringi)(0x1f03,en._4_4_);
          if (pGVar2 == (GLubyte *)0x0) {
            _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)en._4_4_);
            return 0;
          }
          iVar1 = strcmp((char *)pGVar2,(char *)window);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
      extension_local._4_4_ = _glfwPlatformExtensionSupported((char *)window);
    }
  }
  return extension_local._4_4_;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

#if defined(_GLFW_USE_OPENGL)
    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
    else
#endif // _GLFW_USE_OPENGL
    {
        // Check if extension is in the old style OpenGL extensions string

        const GLubyte* extensions = glGetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}